

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cpp
# Opt level: O0

void __thiscall uv11::Async::Async(Async *this,Loop *loop,Callback *cb)

{
  uv_loop_t *puVar1;
  uv_async_s *puVar2;
  _func_void_uv_async_t_ptr *p_Var3;
  __0 local_2d [13];
  function<void_(uv11::Async_&)> *local_20;
  Callback *cb_local;
  Loop *loop_local;
  Async *this_local;
  
  (this->super_HandleBase<uv_async_s>).super_Handle._vptr_Handle =
       (_func_int **)&PTR__Async_00113c30;
  local_20 = cb;
  cb_local = (Callback *)loop;
  loop_local = (Loop *)this;
  HandleBase<uv_async_s>::HandleBase(&this->super_HandleBase<uv_async_s>,this);
  (this->super_HandleBase<uv_async_s>).super_Handle._vptr_Handle =
       (_func_int **)&PTR__Async_00113c30;
  std::function<void_(uv11::Async_&)>::function(&this->async_cb,local_20);
  puVar1 = Loop::Get((Loop *)cb_local);
  puVar2 = WrappedObject<uv_async_s>::Get
                     (&(this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>);
  p_Var3 = Async(uv11::Loop&,std::function_const&)::$_0::operator_cast_to_function_pointer(local_2d)
  ;
  uv_async_init(puVar1,puVar2,p_Var3);
  return;
}

Assistant:

Async::Async(Loop& loop, Async::Callback const& cb) : HandleBase(this), async_cb(cb) {
    ::uv_async_init(&loop.Get(), &this->Get(), [] (::uv_async_t* handle ) {
        Async* a = reinterpret_cast<Async*>(handle->data);
        auto callback = a->async_cb;
        callback(*a);
    });
}